

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::processPriorityCommand(CommonCore *this,ActionMessage *command)

{
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  string_view searchValue;
  string_view federateName;
  string_view federateName_00;
  string_view existingValue;
  string_view estring_00;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  __type_conflict _Var1;
  bool bVar2;
  __int_type_conflict4 _Var3;
  __int_type_conflict1 _Var4;
  action_t aVar5;
  GlobalBrokerId GVar6;
  int32_t val;
  FedInfo *pFVar7;
  pointer this_00;
  pointer this_01;
  FederateState *pFVar8;
  ActionMessage *in_RSI;
  CommonCore *in_RDI;
  optional<unsigned_long> oVar9;
  __sv_type _Var10;
  string_view sVar11;
  FederateState *fed_2;
  FederateState *fed_1;
  string *target;
  ActionMessage *in_stack_00000170;
  FederateState *in_stack_00000178;
  FederateState *fed;
  ActionMessage init;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> estring;
  ActionMessage resend;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> lfed;
  optional<unsigned_long> insertRes;
  ActionMessage pngrep;
  ActionMessage *in_stack_fffffffffffff838;
  undefined4 uVar12;
  FederateState *in_stack_fffffffffffff840;
  ActionMessage *in_stack_fffffffffffff848;
  TimeoutMonitor *in_stack_fffffffffffff850;
  undefined4 in_stack_fffffffffffff858;
  action_t in_stack_fffffffffffff85c;
  ActionMessage *in_stack_fffffffffffff860;
  CommonCore *in_stack_fffffffffffff868;
  undefined1 *puVar13;
  undefined4 in_stack_fffffffffffff870;
  GlobalFederateId in_stack_fffffffffffff874;
  CommonCore *in_stack_fffffffffffff878;
  CommonCore *in_stack_fffffffffffff880;
  GlobalFederateId federateID;
  DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
  *in_stack_fffffffffffff888;
  char *in_stack_fffffffffffff890;
  undefined4 in_stack_fffffffffffff898;
  undefined4 in_stack_fffffffffffff89c;
  CommonCore *in_stack_fffffffffffff8a0;
  CommonCore *in_stack_fffffffffffff8a8;
  char *in_stack_fffffffffffff8b0;
  GlobalFederateId local_6fc;
  undefined4 local_6f8;
  BaseType local_6f4;
  FederateState *local_6f0;
  BaseType local_6e4;
  __sv_type local_6e0;
  FederateState *local_6d0;
  string *local_6c8;
  undefined4 local_6c0;
  BaseType local_6bc;
  undefined1 in_stack_fffffffffffff948 [16];
  route_id local_6a8;
  BaseType local_6a4;
  string_view local_6a0;
  BaseType local_690;
  BaseType local_68c;
  undefined1 local_688 [8];
  string_view local_680;
  char *local_670;
  undefined8 in_stack_fffffffffffff998;
  pointer pbVar14;
  BrokerBase *in_stack_fffffffffffff9a0;
  string_view in_stack_fffffffffffff9a8;
  GlobalFederateId in_stack_fffffffffffff9bc;
  ActionMessage *local_640;
  FederateState *pFStack_638;
  undefined1 in_stack_fffffffffffff9d0 [16];
  undefined4 in_stack_fffffffffffff9e0;
  GlobalFederateId in_stack_fffffffffffff9e4;
  undefined4 in_stack_fffffffffffffa08;
  GlobalFederateId in_stack_fffffffffffffa0c;
  undefined4 in_stack_fffffffffffffa10;
  GlobalFederateId in_stack_fffffffffffffa14;
  char *in_stack_fffffffffffffa18;
  int in_stack_fffffffffffffa74;
  BrokerBase *in_stack_fffffffffffffa78;
  string_view in_stack_fffffffffffffa80;
  format_args in_stack_fffffffffffffaa0;
  string_view in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffadc;
  GlobalFederateId in_stack_fffffffffffffae0;
  undefined4 in_stack_fffffffffffffae4;
  undefined4 in_stack_fffffffffffffae8;
  undefined4 in_stack_fffffffffffffaec;
  undefined4 in_stack_fffffffffffffb00;
  undefined4 in_stack_fffffffffffffb04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_4f0;
  GlobalFederateId local_4d4;
  __sv_type local_4d0;
  __sv_type local_4c0;
  allocator<char> local_489 [65];
  __sv_type local_448;
  string_view local_438;
  undefined4 local_424;
  __sv_type local_410;
  undefined4 local_400;
  GlobalFederateId local_3fc [5];
  __sv_type local_3e8;
  BaseType local_3d8;
  GlobalFederateId local_3d4;
  __sv_type local_3d0;
  string_view local_3c0;
  undefined4 local_3ac;
  ActionMessage *in_stack_fffffffffffffca8;
  CommonCore *in_stack_fffffffffffffcb0;
  CommonCore *in_stack_fffffffffffffcf0;
  GlobalFederateId local_2e8;
  undefined4 local_2e4;
  string_view local_2e0;
  BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**> local_2d0;
  string_view local_2b8;
  FederateState *local_2a8 [2];
  string_view local_298;
  _Storage<unsigned_long,_true> local_288;
  undefined1 local_280;
  BaseType local_278;
  GlobalFederateId local_274 [3];
  BaseType local_268;
  BaseType local_260;
  BaseType local_1b8;
  BaseType local_1a4;
  undefined1 local_1a0 [32];
  char *local_180;
  baseType local_178;
  undefined1 local_170 [32];
  __sv_type local_150;
  __sv_type local_140;
  BaseType local_130;
  GlobalFederateId local_12c;
  ActionMessage *local_128;
  undefined1 local_118 [40];
  Time local_f0;
  Time local_e8;
  Time TStack_e0;
  BaseType *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  baseType bStack_b8;
  undefined1 *local_b0;
  undefined1 local_a8 [16];
  pointer local_98;
  byte *local_88;
  undefined1 *local_80;
  pointer local_78;
  pointer pbStack_70;
  pointer local_68;
  string_view *local_60;
  pointer local_58;
  pointer pbStack_50;
  undefined1 *local_48;
  BaseType local_3c;
  undefined1 *local_38;
  ActionMessage *in_stack_ffffffffffffffd0;
  CommonCore *in_stack_ffffffffffffffd8;
  
  local_128 = in_RSI;
  _Var4 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)in_stack_fffffffffffff848);
  local_640 = in_stack_fffffffffffff838;
  pFStack_638 = in_stack_fffffffffffff840;
  if (0x17 < _Var4) {
    local_130 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
    GlobalFederateId::GlobalFederateId(&local_12c,(GlobalBrokerId)local_130);
    getIdentifier_abi_cxx11_(in_RDI);
    local_140 = std::__cxx11::string::operator_cast_to_basic_string_view
                          (&in_stack_fffffffffffff840->name);
    local_180 = "|| priority_cmd:{} from {}";
    local_178 = 0x1a;
    prettyPrintString_abi_cxx11_
              ((ActionMessage *)CONCAT44(in_stack_fffffffffffffb04,in_stack_fffffffffffffb00));
    local_1a4 = GlobalFederateId::baseValue(&local_128->source_id);
    local_b0 = local_170;
    local_c0 = local_180;
    bStack_b8 = local_178;
    local_c8 = local_1a0;
    local_d0 = &local_1a4;
    local_e8.internalTimeCode = (baseType)local_180;
    TStack_e0.internalTimeCode = local_178;
    ::fmt::v11::detail::value<fmt::v11::context>::
    value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char,_0>
              ((value<fmt::v11::context> *)in_stack_fffffffffffff850,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff848);
    local_38 = local_118 + 0x10;
    local_3c = *local_d0;
    in_stack_ffffffffffffffd8 = (CommonCore *)(local_118 + 0x20);
    in_stack_ffffffffffffffd0 = (ActionMessage *)local_118;
    local_118._32_8_ = 0x1d;
    local_118._16_4_ = local_3c;
    local_f0.internalTimeCode = (baseType)in_stack_ffffffffffffffd0;
    ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa0);
    local_150 = std::__cxx11::string::operator_cast_to_basic_string_view
                          (&in_stack_fffffffffffff840->name);
    message._M_len._4_4_ = in_stack_fffffffffffffae4;
    message._M_len._0_4_ = in_stack_fffffffffffffae0.gid;
    message._M_str._0_4_ = in_stack_fffffffffffffae8;
    message._M_str._4_4_ = in_stack_fffffffffffffaec;
    local_640 = (ActionMessage *)local_150._M_len;
    pFStack_638 = (FederateState *)local_150._M_str;
    BrokerBase::sendToLogger
              (in_stack_fffffffffffff9a0,in_stack_fffffffffffff9bc,
               (int)((ulong)in_stack_fffffffffffff998 >> 0x20),in_stack_fffffffffffff9a8,message,
               SUB81((ulong)in_stack_fffffffffffff998 >> 0x18,0));
    std::__cxx11::string::~string(&pFStack_638->name);
    std::__cxx11::string::~string(&pFStack_638->name);
  }
  aVar5 = ActionMessage::action(local_128);
  if (aVar5 == cmd_set_global) {
    local_6f8 = 0;
    bVar2 = GlobalBrokerId::operator!=
                      (&(in_RDI->super_BrokerBase).global_broker_id_local,(GlobalBrokerId)0x0);
    if (!bVar2) {
      gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::push<helics::ActionMessage>
                ((SimpleQueue<helics::ActionMessage,_std::mutex> *)in_stack_fffffffffffff880,
                 (ActionMessage *)in_stack_fffffffffffff878);
      return;
    }
    GlobalFederateId::GlobalFederateId
              (&local_6fc,(GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
    (local_128->source_id).gid = local_6fc.gid;
    (*(in_RDI->super_Core)._vptr_Core[0x6c])(in_RDI,0,local_128);
    return;
  }
  if (aVar5 == cmd_reg_broker) {
    local_3c0 = ActionMessage::name((ActionMessage *)0x56143d);
    local_3d0 = std::__cxx11::string::operator_cast_to_basic_string_view(&pFStack_638->name);
    __x._M_str._0_4_ = in_stack_fffffffffffff870;
    __x._M_len = (size_t)in_stack_fffffffffffff868;
    __x._M_str._4_4_ = in_stack_fffffffffffff874.gid;
    __y._M_len._4_4_ = in_stack_fffffffffffff85c;
    __y._M_len._0_4_ = in_stack_fffffffffffff858;
    __y._M_str = (char *)in_stack_fffffffffffff860;
    bVar2 = std::operator==(__x,__y);
    if (!bVar2) {
      local_400 = 0;
      GlobalFederateId::GlobalFederateId(local_3fc,(GlobalBrokerId)0x0);
      local_410 = std::__cxx11::string::operator_cast_to_basic_string_view(&pFStack_638->name);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff850,
                 (char *)in_stack_fffffffffffff848);
      message_01._M_len._4_4_ = in_stack_fffffffffffffae4;
      message_01._M_len._0_4_ = in_stack_fffffffffffffae0.gid;
      message_01._M_str._0_4_ = in_stack_fffffffffffffae8;
      message_01._M_str._4_4_ = in_stack_fffffffffffffaec;
      BrokerBase::sendToLogger
                (in_stack_fffffffffffff9a0,in_stack_fffffffffffff9bc,
                 (int)((ulong)in_stack_fffffffffffff998 >> 0x20),in_stack_fffffffffffff9a8,
                 message_01,SUB81((ulong)in_stack_fffffffffffff998 >> 0x18,0));
      local_424 = 0;
      (*(in_RDI->super_Core)._vptr_Core[0x6b])(in_RDI,0,local_128);
      return;
    }
    local_3d8 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
    GlobalFederateId::GlobalFederateId(&local_3d4,(GlobalBrokerId)local_3d8);
    local_3e8 = std::__cxx11::string::operator_cast_to_basic_string_view(&pFStack_638->name);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff850,
               (char *)in_stack_fffffffffffff848);
    message_00._M_len._4_4_ = in_stack_fffffffffffffae4;
    message_00._M_len._0_4_ = in_stack_fffffffffffffae0.gid;
    message_00._M_str._0_4_ = in_stack_fffffffffffffae8;
    message_00._M_str._4_4_ = in_stack_fffffffffffffaec;
    BrokerBase::sendToLogger
              (in_stack_fffffffffffff9a0,in_stack_fffffffffffff9bc,
               (int)((ulong)in_stack_fffffffffffff998 >> 0x20),in_stack_fffffffffffff9a8,message_00,
               SUB81((ulong)in_stack_fffffffffffff998 >> 0x18,0));
    return;
  }
  if ((uint)(aVar5 + ~(cmd_reg_broker|cmd_tick)) < 2) {
LAB_0056235e:
    processQueryCommand(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    return;
  }
  if (aVar5 == cmd_ping_priority) {
    local_1b8 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
    bVar2 = GlobalFederateId::operator==(&local_128->dest_id,(GlobalBrokerId)local_1b8);
    if (!bVar2) {
      return;
    }
    ActionMessage::ActionMessage(in_stack_fffffffffffff860,in_stack_fffffffffffff85c);
    local_260 = (local_128->source_id).gid;
    local_278 = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
    GlobalFederateId::GlobalFederateId(local_274,(GlobalBrokerId)local_278);
    local_268 = local_274[0].gid;
    routeMessage((CommonCore *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0.gid),
                 (ActionMessage *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    ActionMessage::~ActionMessage((ActionMessage *)pFStack_638);
    return;
  }
  if (aVar5 == cmd_priority_ack) {
    return;
  }
  if (aVar5 == cmd_reg_fed) {
    local_298 = ActionMessage::name((ActionMessage *)0x561196);
    local_2b8 = ActionMessage::name((ActionMessage *)0x5611b3);
    sVar11._M_str = in_stack_fffffffffffff8b0;
    sVar11._M_len = (size_t)in_stack_fffffffffffff8a8;
    local_2a8[0] = getFederate(in_stack_fffffffffffff8a0,sVar11);
    oVar9 = gmlc::containers::
            DualStringMappedVector<helics::FedInfo,helics::GlobalFederateId,(reference_stability)0,5>
            ::insert<helics::FederateState*>
                      (&in_RDI->loopFederates,local_298._M_len,local_298._M_str,local_2a8);
    local_288._M_value =
         oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>._M_payload;
    local_280 = oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged;
    bVar2 = std::optional::operator_cast_to_bool((optional<unsigned_long> *)0x561229);
    if ((!bVar2) &&
       (bVar2 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                          (local_128,reentrant_flag), bVar2)) {
      local_2e0 = ActionMessage::name((ActionMessage *)0x56126c);
      searchValue._M_str = in_stack_fffffffffffff890;
      searchValue._M_len = (size_t)in_stack_fffffffffffff888;
      gmlc::containers::
      DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
      find((DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
            *)in_stack_fffffffffffff880,searchValue);
      pFVar7 = gmlc::containers::BlockIterator<helics::FedInfo,_32,_helics::FedInfo_**>::operator->
                         (&local_2d0);
      pFVar7->state = OPERATING;
    }
    local_2e4 = 0;
    bVar2 = GlobalBrokerId::operator!=
                      (&(in_RDI->super_BrokerBase).global_broker_id_local,(GlobalBrokerId)0x0);
    if (!bVar2) {
      gmlc::containers::SimpleQueue<helics::ActionMessage,_std::mutex>::push<helics::ActionMessage>
                ((SimpleQueue<helics::ActionMessage,_std::mutex> *)in_stack_fffffffffffff880,
                 (ActionMessage *)in_stack_fffffffffffff878);
      return;
    }
    GlobalFederateId::GlobalFederateId
              (&local_2e8,(GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
    (local_128->source_id).gid = local_2e8.gid;
    (*(in_RDI->super_Core)._vptr_Core[0x6c])(in_RDI,0,local_128);
    return;
  }
  if (aVar5 != cmd_send_command) {
    if (aVar5 != cmd_broker_query) {
      if (aVar5 == cmd_broker_ack) {
        local_438 = ActionMessage::name((ActionMessage *)0x56163a);
        local_448 = std::__cxx11::string::operator_cast_to_basic_string_view(&pFStack_638->name);
        __x_00._M_str._0_4_ = in_stack_fffffffffffff870;
        __x_00._M_len = (size_t)in_stack_fffffffffffff868;
        __x_00._M_str._4_4_ = in_stack_fffffffffffff874.gid;
        __y_00._M_len._4_4_ = in_stack_fffffffffffff85c;
        __y_00._M_len._0_4_ = in_stack_fffffffffffff858;
        __y_00._M_str = (char *)in_stack_fffffffffffff860;
        bVar2 = std::operator==(__x_00,__y_00);
        if (!bVar2) {
          return;
        }
        bVar2 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(local_128,error_flag);
        if (bVar2) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff880,(char *)in_stack_fffffffffffff878,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffff874.gid,in_stack_fffffffffffff870));
          errorMessageString_abi_cxx11_((ActionMessage *)in_stack_fffffffffffff878);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff878,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffff874.gid,in_stack_fffffffffffff870));
          std::__cxx11::string::~string(&pFStack_638->name);
          std::__cxx11::string::~string(&pFStack_638->name);
          std::allocator<char>::~allocator(local_489);
          local_4c0 = std::__cxx11::string::operator_cast_to_basic_string_view(&pFStack_638->name);
          BrokerBase::setErrorState
                    (in_stack_fffffffffffffa78,in_stack_fffffffffffffa74,in_stack_fffffffffffffa80);
          local_4d0 = std::__cxx11::string::operator_cast_to_basic_string_view(&pFStack_638->name);
          estring_00._M_len._4_4_ = in_stack_fffffffffffffa14.gid;
          estring_00._M_len._0_4_ = in_stack_fffffffffffffa10;
          estring_00._M_str = in_stack_fffffffffffffa18;
          errorRespondDelayedMessages
                    ((CommonCore *)CONCAT44(in_stack_fffffffffffffa0c.gid,in_stack_fffffffffffffa08)
                     ,estring_00);
          GlobalFederateId::GlobalFederateId(&local_4d4,(GlobalBrokerId)0x0);
          std::__cxx11::string::operator_cast_to_basic_string_view(&pFStack_638->name);
          _Var10 = std::__cxx11::string::operator_cast_to_basic_string_view(&pFStack_638->name);
          pbStack_4f0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        _Var10._M_str;
          message_02._M_len._4_4_ = in_stack_fffffffffffffae4;
          message_02._M_len._0_4_ = in_stack_fffffffffffffae0.gid;
          message_02._M_str._0_4_ = in_stack_fffffffffffffae8;
          message_02._M_str._4_4_ = in_stack_fffffffffffffaec;
          BrokerBase::sendToLogger
                    (in_stack_fffffffffffff9a0,in_stack_fffffffffffff9bc,
                     (int)((ulong)in_stack_fffffffffffff998 >> 0x20),in_stack_fffffffffffff9a8,
                     message_02,SUB81((ulong)in_stack_fffffffffffff998 >> 0x18,0));
          std::__cxx11::string::~string(pbStack_4f0);
          return;
        }
        GlobalFederateId::operator_cast_to_GlobalBrokerId((GlobalFederateId *)local_640);
        std::atomic<helics::GlobalBrokerId>::operator=
                  ((atomic<helics::GlobalBrokerId> *)local_640,(GlobalBrokerId)(BaseType)pFStack_638
                  );
        GVar6 = GlobalFederateId::operator_cast_to_GlobalBrokerId((GlobalFederateId *)local_640);
        (in_RDI->super_BrokerBase).global_broker_id_local.gid = GVar6.gid;
        getSpecialFederateId
                  ((GlobalBrokerId)(BaseType)pFStack_638,(BaseType)((ulong)local_640 >> 0x20));
        std::atomic<helics::GlobalFederateId>::operator=
                  ((atomic<helics::GlobalFederateId> *)local_640,
                   (GlobalFederateId)(BaseType)pFStack_638);
        getSpecialFederateId
                  ((GlobalBrokerId)(BaseType)pFStack_638,(BaseType)((ulong)local_640 >> 0x20));
        std::atomic<helics::GlobalFederateId>::operator=
                  ((atomic<helics::GlobalFederateId> *)local_640,
                   (GlobalFederateId)(BaseType)pFStack_638);
        this_00 = CLI::std::
                  unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                  ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                                *)0x561a32);
        GlobalFederateId::GlobalFederateId
                  ((GlobalFederateId *)&stack0xfffffffffffffae0,
                   (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
        BaseTimeCoordinator::setSourceId(this_00,in_stack_fffffffffffffae0);
        GVar6 = GlobalFederateId::operator_cast_to_GlobalBrokerId((GlobalFederateId *)local_640);
        uVar12 = (undefined4)((ulong)local_640 >> 0x20);
        (in_RDI->super_BrokerBase).higher_broker_id.gid = GVar6.gid;
        transmitDelayedMessages
                  ((CommonCore *)CONCAT44(in_stack_fffffffffffff9e4.gid,in_stack_fffffffffffff9e0));
        std::unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>::
        operator->((unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                    *)0x561ab4);
        TimeoutMonitor::setParentId
                  ((TimeoutMonitor *)in_stack_fffffffffffff848,
                   (GlobalBrokerId)(BaseType)((ulong)in_stack_fffffffffffff850 >> 0x20));
        bVar2 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                          (local_128,slow_responding_flag);
        if (bVar2) {
          this_01 = std::
                    unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                    ::operator->((unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                                  *)0x561b01);
          TimeoutMonitor::disableParentPing(this_01,true);
        }
        bVar2 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                          (local_128,global_timing_flag);
        if (bVar2) {
          (in_RDI->super_BrokerBase).globalTime = true;
          bVar2 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                            (local_128,async_timing_flag);
          if (bVar2) {
            (in_RDI->super_BrokerBase).asyncTime = true;
          }
        }
        bVar2 = checkActionFlag<helics::ActionMessage,helics::ConnectionFlags>
                          (local_128,global_disconnect_flag);
        if (bVar2) {
          (in_RDI->super_BrokerBase).globalDisconnect = true;
        }
        std::unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>::
        operator->((unique_ptr<helics::TimeoutMonitor,_std::default_delete<helics::TimeoutMonitor>_>
                    *)0x561b99);
        TimeoutMonitor::reset(in_stack_fffffffffffff850);
        _Var3 = std::__atomic_base::operator_cast_to_short
                          ((__atomic_base<short> *)in_stack_fffffffffffff848);
        if (-1 < _Var3) {
          return;
        }
        if ((in_RDI->super_BrokerBase).minFederateCount != 0) {
          return;
        }
        if ((in_RDI->super_BrokerBase).minChildCount != 0) {
          return;
        }
        bVar2 = allInitReady(in_stack_fffffffffffff8a8);
        if (!bVar2) {
          return;
        }
        bVar2 = BrokerBase::transitionBrokerState
                          ((BrokerBase *)pFStack_638,(BrokerState)((uint)uVar12 >> 0x10),
                           (BrokerState)uVar12);
        if (!bVar2) {
          return;
        }
        ActionMessage::ActionMessage(in_stack_fffffffffffff860,in_stack_fffffffffffff85c);
        bVar2 = std::atomic<bool>::load
                          ((atomic<bool> *)in_stack_fffffffffffff848,
                           (memory_order)((ulong)pFStack_638 >> 0x20));
        if (bVar2) {
          setActionFlag<helics::ActionMessage,helics::TimingFlags>
                    ((ActionMessage *)&stack0xfffffffffffffa18,iteration_requested_flag);
        }
        checkDependencies(in_stack_fffffffffffffcf0);
        GlobalFederateId::GlobalFederateId
                  ((GlobalFederateId *)&stack0xfffffffffffffa14,
                   (GlobalBrokerId)(in_RDI->super_BrokerBase).global_broker_id_local.gid);
        GlobalFederateId::GlobalFederateId
                  ((GlobalFederateId *)&stack0xfffffffffffffa0c,(GlobalBrokerId)0x0);
        (*(in_RDI->super_Core)._vptr_Core[0x6b])(in_RDI,0,&stack0xfffffffffffffa18);
        ActionMessage::~ActionMessage((ActionMessage *)pFStack_638);
        return;
      }
      if (aVar5 == cmd_fed_ack) {
        ActionMessage::name((ActionMessage *)0x561d58);
        federateName._M_str = in_stack_fffffffffffff890;
        federateName._M_len = (size_t)in_stack_fffffffffffff888;
        pFVar8 = getFederateCore(in_stack_fffffffffffff880,federateName);
        if (pFVar8 == (FederateState *)0x0) {
          return;
        }
        bVar2 = checkActionFlag<helics::ActionMessage,helics::GeneralFlags>(local_128,error_flag);
        if (bVar2) {
          GlobalFederateId::GlobalFederateId
                    ((GlobalFederateId *)&stack0xfffffffffffff9e4,(GlobalBrokerId)0x0);
          std::__cxx11::string::operator_cast_to_basic_string_view(&pFStack_638->name);
          local_670 = "broker responded with error for registration of {}::{}\n";
          pbVar14 = (pointer)0x37;
          local_680 = ActionMessage::name((ActionMessage *)0x561e30);
          local_688 = (undefined1  [8])
                      commandErrorString((int)((ulong)in_stack_fffffffffffff850 >> 0x20));
          local_48 = &stack0xfffffffffffff9a0;
          local_58 = (pointer)local_670;
          local_60 = &local_680;
          local_68 = (pointer)local_688;
          local_78 = (pointer)local_670;
          puVar13 = local_a8;
          pbStack_70 = pbVar14;
          pbStack_50 = pbVar14;
          ::fmt::v11::detail::value<fmt::v11::context>::
          value<std::basic_string_view<char,_std::char_traits<char>_>,_char,_0>
                    ((value<fmt::v11::context> *)in_stack_fffffffffffff850,
                     (basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffff848);
          local_98 = (local_68->_M_dataplus)._M_p;
          local_88 = (byte *)0xcd;
          local_80 = puVar13;
          ::fmt::v11::vformat_abi_cxx11_(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa0);
          _Var10 = std::__cxx11::string::operator_cast_to_basic_string_view(&pFStack_638->name);
          local_640 = (ActionMessage *)_Var10._M_len;
          pFStack_638 = (FederateState *)_Var10._M_str;
          message_03._M_len._4_4_ = in_stack_fffffffffffffae4;
          message_03._M_len._0_4_ = in_stack_fffffffffffffae0.gid;
          message_03._M_str._0_4_ = in_stack_fffffffffffffae8;
          message_03._M_str._4_4_ = in_stack_fffffffffffffaec;
          BrokerBase::sendToLogger
                    (in_stack_fffffffffffff9a0,in_stack_fffffffffffff9bc,
                     (int)((ulong)pbVar14 >> 0x20),in_stack_fffffffffffff9a8,message_03,
                     SUB81((ulong)pbVar14 >> 0x18,0));
          std::__cxx11::string::~string(&pFStack_638->name);
        }
        else {
          local_68c = (local_128->dest_id).gid;
          local_690 = (BaseType)
                      std::atomic<helics::GlobalFederateId>::operator=
                                ((atomic<helics::GlobalFederateId> *)local_640,
                                 (GlobalFederateId)(BaseType)pFStack_638);
          local_6a0 = ActionMessage::name((ActionMessage *)0x56205c);
          existingValue._M_str._0_4_ = in_stack_fffffffffffff898;
          existingValue._M_len = (size_t)in_stack_fffffffffffff890;
          existingValue._M_str._4_4_ = in_stack_fffffffffffff89c;
          gmlc::containers::
          DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
          ::addSearchTerm(in_stack_fffffffffffff888,(GlobalFederateId *)in_stack_fffffffffffff880,
                          existingValue);
          bVar2 = GlobalFederateId::isValid(&in_RDI->keyFed);
          if (!bVar2) {
            local_6a4 = (BaseType)
                        std::atomic::operator_cast_to_GlobalFederateId
                                  ((atomic<helics::GlobalFederateId> *)local_640);
            (in_RDI->keyFed).gid = local_6a4;
          }
        }
        FederateState::addAction(pFStack_638,local_640);
        return;
      }
      if (aVar5 == cmd_route_ack) {
        return;
      }
      if (aVar5 == cmd_register_route) {
        val = ActionMessage::getExtraData((ActionMessage *)0x5620fb);
        route_id::route_id(&local_6a8,val);
        sVar11 = SmallBuffer::to_string((SmallBuffer *)0x56211b);
        (*(in_RDI->super_Core)._vptr_Core[0x6d])
                  (in_RDI,(ulong)(uint)local_6a8.rid,0,sVar11._M_len,sVar11._M_str);
        return;
      }
      if (aVar5 != cmd_priority_disconnect) {
        if (aVar5 == cmd_broker_location) {
          ActionMessage::setAction(local_128,cmd_protocol);
          local_128->messageID = 0x14d;
          (*(in_RDI->super_Core)._vptr_Core[0x6c])(in_RDI,0xffffffff,local_128);
          ActionMessage::ActionMessage(in_stack_fffffffffffff860,in_stack_fffffffffffff85c);
          local_3ac = 0xefffffd8;
          BrokerBase::addActionMessage((BrokerBase *)pFStack_638,local_640);
          ActionMessage::~ActionMessage((ActionMessage *)pFStack_638);
          return;
        }
        bVar2 = isPriorityCommand((ActionMessage *)0x56243e);
        if (bVar2) {
          return;
        }
        processCommand(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
        return;
      }
      checkAndProcessDisconnect
                ((CommonCore *)CONCAT44(in_stack_fffffffffffffa0c.gid,in_stack_fffffffffffffa08));
      return;
    }
    goto LAB_0056235e;
  }
  local_6bc = (in_RDI->super_BrokerBase).global_broker_id_local.gid;
  bVar2 = GlobalFederateId::operator==(&local_128->dest_id,(GlobalBrokerId)local_6bc);
  if (bVar2) {
    processCommandInstruction(in_stack_fffffffffffff9d0._8_8_,in_stack_fffffffffffff9d0._0_8_);
    return;
  }
  local_6c0 = 0;
  bVar2 = GlobalFederateId::operator==(&local_128->dest_id,(GlobalBrokerId)0x0);
  if (bVar2) {
    local_6c8 = ActionMessage::getString_abi_cxx11_
                          (in_stack_fffffffffffff848,(int)((ulong)pFStack_638 >> 0x20));
    bVar2 = std::operator==(&pFStack_638->name,(char *)local_640);
    if (!bVar2) {
      getIdentifier_abi_cxx11_(in_RDI);
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffff860,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_fffffffffffff85c,in_stack_fffffffffffff858));
      if (!_Var1) {
        local_6e0 = std::__cxx11::string::operator_cast_to_basic_string_view(&pFStack_638->name);
        federateName_00._M_str = in_stack_fffffffffffff890;
        federateName_00._M_len = (size_t)in_stack_fffffffffffff888;
        local_6d0 = getFederateCore(in_stack_fffffffffffff880,federateName_00);
        if (local_6d0 != (FederateState *)0x0) {
          FederateState::sendCommand(in_stack_00000178,in_stack_00000170);
          return;
        }
        local_6d0 = (FederateState *)0x0;
        goto LAB_005622c3;
      }
    }
    processCommandInstruction(in_stack_fffffffffffff9d0._8_8_,in_stack_fffffffffffff9d0._0_8_);
  }
  else {
LAB_005622c3:
    federateID.gid = (BaseType)((ulong)in_stack_fffffffffffff880 >> 0x20);
    local_6e4 = (local_128->dest_id).gid;
    bVar2 = isLocal(in_stack_fffffffffffff868,in_stack_fffffffffffff874);
    if (bVar2) {
      local_6f4 = (local_128->dest_id).gid;
      local_6f0 = getFederateCore(in_stack_fffffffffffff878,federateID);
      if (local_6f0 != (FederateState *)0x0) {
        FederateState::sendCommand(in_stack_00000178,in_stack_00000170);
        return;
      }
      local_6f0 = (FederateState *)0x0;
    }
    routeMessage(in_stack_fffffffffffff948._8_8_,in_stack_fffffffffffff948._0_8_);
  }
  return;
}

Assistant:

void CommonCore::processPriorityCommand(ActionMessage&& command)
{
    // deal with a few types of message immediately
    LOG_TRACE(global_broker_id_local,
              getIdentifier(),
              fmt::format("|| priority_cmd:{} from {}",
                          prettyPrintString(command),
                          command.source_id.baseValue()));
    switch (command.action()) {
        case CMD_PING_PRIORITY:
            if (command.dest_id == global_broker_id_local) {
                ActionMessage pngrep(CMD_PING_REPLY);
                pngrep.dest_id = command.source_id;
                pngrep.source_id = global_broker_id_local;
                routeMessage(pngrep);
            }
            break;
        case CMD_REG_FED: {
            // this one in the core needs to be the thread-safe version of getFederate
            auto insertRes =
                loopFederates.insert(command.name(), no_search, getFederate(command.name()));
            if (!insertRes && checkActionFlag(command, reentrant_flag)) {
                auto lfed = loopFederates.find(command.name());
                lfed->state = OperatingState::OPERATING;
            }

            if (global_broker_id_local != parent_broker_id) {
                // forward on to Broker
                command.source_id = global_broker_id_local;
                transmit(parent_route_id, std::move(command));
            } else {
                // this will get processed when this core is assigned a global hid
                delayTransmitQueue.push(std::move(command));
            }

        } break;
        case CMD_BROKER_LOCATION: {
            command.setAction(CMD_PROTOCOL);
            command.messageID = NEW_BROKER_INFORMATION;
            transmit(control_route, std::move(command));
            ActionMessage resend(CMD_RESEND);
            resend.messageID = static_cast<int32_t>(CMD_REG_BROKER);
            addActionMessage(resend);
        } break;
        case CMD_REG_BROKER:
            // These really shouldn't happen here probably means something went wrong in setup but
            // we can handle it forward the connection request to the higher level
            if (command.name() == identifier) {
                LOG_ERROR(
                    global_broker_id_local,
                    identifier,
                    "received locally sent registration message, broker loop, please set the broker address to "
                    "a valid broker");
            } else {
                LOG_WARNING(parent_broker_id,
                            identifier,
                            "Core received reg broker message, likely improper federation setup\n");
                transmit(parent_route_id, command);
            }
            break;
        case CMD_BROKER_ACK:
            if (command.name() == identifier) {
                if (checkActionFlag(command, error_flag)) {
                    auto estring =
                        std::string("broker responded with error: ") + errorMessageString(command);
                    setErrorState(command.messageID, estring);
                    errorRespondDelayedMessages(estring);
                    LOG_ERROR(parent_broker_id, identifier, estring);
                    break;
                }
                global_id = GlobalBrokerId{command.dest_id};
                global_broker_id_local = GlobalBrokerId{command.dest_id};
                filterFedID = getSpecialFederateId(global_broker_id_local, 0);
                translatorFedID = getSpecialFederateId(global_broker_id_local, 1);
                timeCoord->setSourceId(global_broker_id_local);

                higher_broker_id = GlobalBrokerId{command.source_id};
                transmitDelayedMessages();
                timeoutMon->setParentId(higher_broker_id);
                if (checkActionFlag(command, slow_responding_flag)) {
                    timeoutMon->disableParentPing();
                }
                if (checkActionFlag(command, global_timing_flag)) {
                    globalTime = true;
                    if (checkActionFlag(command, async_timing_flag)) {
                        asyncTime = true;
                    }
                }
                if (checkActionFlag(command, global_disconnect_flag)) {
                    globalDisconnect = true;
                }
                timeoutMon->reset();
                if (delayInitCounter < 0 && minFederateCount == 0 && minChildCount == 0) {
                    if (allInitReady()) {
                        if (transitionBrokerState(BrokerState::CONNECTED,
                                                  BrokerState::INITIALIZING)) {
                            // make sure we only do this once
                            ActionMessage init(CMD_INIT);
                            if (initIterations.load()) {
                                setActionFlag(init, iteration_requested_flag);
                            }
                            checkDependencies();
                            init.source_id = global_broker_id_local;
                            init.dest_id = parent_broker_id;
                            transmit(parent_route_id, init);
                        }
                    }
                }
            }
            break;
        case CMD_FED_ACK: {
            FederateState* fed{nullptr};
            fed = getFederateCore(command.name());
            if (fed != nullptr) {
                if (checkActionFlag(command, error_flag)) {
                    LOG_ERROR(
                        parent_broker_id,
                        identifier,
                        fmt::format("broker responded with error for registration of {}::{}\n",
                                    command.name(),
                                    commandErrorString(command.messageID)));
                } else {
                    fed->global_id = command.dest_id;
                    loopFederates.addSearchTerm(command.dest_id, command.name());
                    if (!keyFed.isValid()) {
                        keyFed = fed->global_id;
                    }
                }

                // push the command to the local queue
                fed->addAction(std::move(command));
            }
        } break;
        case CMD_REG_ROUTE:
            // TODO(PT): double check this
            addRoute(route_id(command.getExtraData()), 0, command.payload.to_string());
            break;
        case CMD_PRIORITY_DISCONNECT:
            checkAndProcessDisconnect();
            break;
        case CMD_SEND_COMMAND:
            if (command.dest_id == global_broker_id_local) {
                processCommandInstruction(command);
                break;
            }
            if (command.dest_id == parent_broker_id) {
                const auto& target = command.getString(targetStringLoc);
                if (target == "core" || target == getIdentifier()) {
                    processCommandInstruction(command);
                    break;
                }
                auto* fed = getFederateCore(target);
                if (fed != nullptr) {
                    fed->sendCommand(command);
                    break;
                }
            }
            if (isLocal(command.dest_id)) {
                auto* fed = getFederateCore(command.dest_id);
                if (fed != nullptr) {
                    fed->sendCommand(command);
                    break;
                }
            }
            routeMessage(std::move(command));
            break;
        case CMD_BROKER_QUERY:
        case CMD_QUERY:
        case CMD_QUERY_REPLY:
            processQueryCommand(command);
            break;
        case CMD_PRIORITY_ACK:
        case CMD_ROUTE_ACK:
            break;
        case CMD_SET_GLOBAL:
            if (global_broker_id_local != parent_broker_id) {
                // forward on to Broker
                command.source_id = global_broker_id_local;
                transmit(parent_route_id, std::move(command));
            } else {
                // this will get processed when this core is assigned a global hid
                delayTransmitQueue.push(std::move(command));
            }
            break;
        default: {
            if (!isPriorityCommand(command)) {
                processCommand(std::move(command));
            }
        }
    }
}